

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::~SubmitCommandBuffer(SubmitCommandBuffer *this)

{
  pointer ppCVar1;
  CmdCommand *pCVar2;
  size_t cmdNdx;
  ulong uVar3;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__SubmitCommandBuffer_00bd49c8;
  uVar3 = 0;
  while( true ) {
    ppCVar1 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_commands).
                      super__Vector_base<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar3)
    break;
    pCVar2 = ppCVar1[uVar3];
    if (pCVar2 != (CmdCommand *)0x0) {
      (*pCVar2->_vptr_CmdCommand[1])();
    }
    uVar3 = uVar3 + 1;
  }
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  std::
  vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
  ::~vector(&this->m_commands);
  return;
}

Assistant:

SubmitCommandBuffer::~SubmitCommandBuffer (void)
{
	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
		delete m_commands[cmdNdx];
}